

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse41.c
# Opt level: O1

void VP8LEncDspInitSSE41(void)

{
  return;
}

Assistant:

WEBP_TSAN_IGNORE_FUNCTION void VP8LEncDspInitSSE41(void) {
  VP8LExtraCost = ExtraCost_SSE41;
  VP8LSubtractGreenFromBlueAndRed = SubtractGreenFromBlueAndRed_SSE41;
  VP8LCollectColorBlueTransforms = CollectColorBlueTransforms_SSE41;
  VP8LCollectColorRedTransforms = CollectColorRedTransforms_SSE41;

  // SSE exports for AVX and above.
  VP8LSubtractGreenFromBlueAndRed_SSE = SubtractGreenFromBlueAndRed_SSE41;
  VP8LCollectColorBlueTransforms_SSE = CollectColorBlueTransforms_SSE41;
  VP8LCollectColorRedTransforms_SSE = CollectColorRedTransforms_SSE41;
}